

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstackedlayout.cpp
# Opt level: O0

bool __thiscall QStackedLayout::hasHeightForWidth(QStackedLayout *this)

{
  int iVar1;
  long *plVar2;
  ulong uVar3;
  long *in_RDI;
  QLayoutItem *item;
  int i;
  int n;
  int local_18;
  
  iVar1 = (**(code **)(*in_RDI + 200))();
  local_18 = 0;
  while( true ) {
    if (iVar1 <= local_18) {
      return false;
    }
    plVar2 = (long *)(**(code **)(*in_RDI + 0xa8))(in_RDI,local_18);
    if ((plVar2 != (long *)0x0) && (uVar3 = (**(code **)(*plVar2 + 0x48))(), (uVar3 & 1) != 0))
    break;
    local_18 = local_18 + 1;
  }
  return true;
}

Assistant:

bool QStackedLayout::hasHeightForWidth() const
{
    const int n = count();

    for (int i = 0; i < n; ++i) {
        if (QLayoutItem *item = itemAt(i)) {
            if (item->hasHeightForWidth())
                return true;
        }
    }
    return false;
}